

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

shared_ptr<tchecker::typed_statement_t> __thiscall
tchecker::details::statement_typechecker_t::acquire_typed_statement(statement_typechecker_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tchecker::typed_statement_t> sVar1;
  shared_ptr<tchecker::typed_statement_t> local_30;
  undefined1 local_19;
  statement_typechecker_t *this_local;
  shared_ptr<tchecker::typed_statement_t> *acquired_typed_stmt;
  
  local_19 = 0;
  this_local = this;
  std::shared_ptr<tchecker::typed_statement_t>::shared_ptr
            ((shared_ptr<tchecker::typed_statement_t> *)this,
             (shared_ptr<tchecker::typed_statement_t> *)(in_RSI + 8));
  std::shared_ptr<tchecker::typed_statement_t>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<tchecker::typed_statement_t>::operator=
            ((shared_ptr<tchecker::typed_statement_t> *)(in_RSI + 8),&local_30);
  std::shared_ptr<tchecker::typed_statement_t>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tchecker::typed_statement_t>)
         sVar1.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t> acquire_typed_statement()
  {
    auto acquired_typed_stmt = _typed_stmt;
    _typed_stmt = nullptr;
    return acquired_typed_stmt;
  }